

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

Aig_Cut_t * Aig_ObjPrepareCuts(Aig_ManCut_t *p,Aig_Obj_t *pObj,int fTriv)

{
  short sVar1;
  int iVar2;
  int iVar3;
  Aig_Cut_t *pAVar4;
  int iVar5;
  char *pcVar6;
  
  pAVar4 = (Aig_Cut_t *)Aig_MmFixedEntryFetch(p->pMemCuts);
  iVar2 = pObj->Id;
  p->pCuts[iVar2] = pAVar4;
  iVar5 = p->nCutsMax;
  if (0 < iVar5) {
    sVar1 = (short)p->nCutSize;
    iVar3 = p->nLeafMax;
    pcVar6 = &p->pCuts[iVar2]->nFanins;
    do {
      *pcVar6 = '\0';
      *(int *)(pcVar6 + -7) = iVar2;
      *(short *)(pcVar6 + -3) = sVar1;
      pcVar6[-1] = (char)iVar3;
      pcVar6 = pcVar6 + sVar1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (fTriv != 0) {
    pAVar4->Cost = 0;
    pAVar4->iNode = iVar2;
    pAVar4->nFanins = '\x01';
    *(int *)&pAVar4[1].pNext = iVar2;
    pAVar4->uSign = 1 << ((byte)pObj->Id & 0x1f);
    if (p->fTruth != 0) {
      memset((char *)((long)&pAVar4[1].pNext + (long)pAVar4->nLeafMax * 4),0xaa,
             (long)p->nTruthWords << 2);
    }
  }
  return pAVar4;
}

Assistant:

Aig_Cut_t * Aig_ObjPrepareCuts( Aig_ManCut_t * p, Aig_Obj_t * pObj, int fTriv )
{
    Aig_Cut_t * pCutSet, * pCut;
    int i;
    // create the cutset of the node
    pCutSet = (Aig_Cut_t *)Aig_MmFixedEntryFetch( p->pMemCuts );
    Aig_ObjSetCuts( p, pObj, pCutSet );
    Aig_ObjForEachCut( p, pObj, pCut, i )
    {
        pCut->nFanins  = 0;
        pCut->iNode    = pObj->Id;
        pCut->nCutSize = p->nCutSize;
        pCut->nLeafMax = p->nLeafMax;
    }
    // add unit cut if needed
    if ( fTriv )
    {
        pCut = pCutSet;
        pCut->Cost = 0;
        pCut->iNode = pObj->Id;
        pCut->nFanins = 1;
        pCut->pFanins[0] = pObj->Id;
        pCut->uSign = Aig_ObjCutSign( pObj->Id );
        if ( p->fTruth )
        memset( Aig_CutTruth(pCut), 0xAA, sizeof(unsigned) * p->nTruthWords );
    }
    return pCutSet;
}